

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

void __thiscall
rr::FragmentProcessor::executeSignedValueWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,BVec4 *colorMask,PixelBufferAccess *colorBuffer)

{
  ulong uVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  long lVar4;
  ConstPixelBufferAccess *pCVar5;
  ulong uVar6;
  ConstPixelBufferAccess *pCVar7;
  int y;
  ConstPixelBufferAccess *this_00;
  IVec4 originalValue;
  IVec4 local_58 [2];
  
  pCVar5 = (ConstPixelBufferAccess *)&this->m_sampleRegister[0].signedValue;
  uVar6 = 0;
  do {
    if (this->m_sampleRegister[uVar6].isAlive == true) {
      uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
      this_00 = (ConstPixelBufferAccess *)(local_58[1].m_data + 2);
      y = (int)((long)uVar1 % (long)numSamplesPerFragment);
      tcu::ConstPixelBufferAccess::getPixelInt
                (this_00,(int)colorBuffer,y,inputFragments[iVar2].pixelCoord.m_data[0]);
      local_58[0].m_data[0] = 0;
      local_58[0].m_data[1] = 0;
      local_58[0].m_data[2] = 0;
      local_58[0].m_data[3] = 0;
      lVar4 = 0;
      pCVar3 = pCVar5;
      do {
        pCVar7 = this_00;
        if (colorMask->m_data[lVar4] != false) {
          pCVar7 = pCVar3;
        }
        local_58[0].m_data[lVar4] = (pCVar7->m_format).order;
        lVar4 = lVar4 + 1;
        this_00 = (ConstPixelBufferAccess *)&(this_00->m_format).type;
        pCVar3 = (ConstPixelBufferAccess *)&(pCVar3->m_format).type;
      } while (lVar4 != 4);
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,local_58,y,inputFragments[iVar2].pixelCoord.m_data[0],
                 inputFragments[iVar2].pixelCoord.m_data[1]);
    }
    uVar6 = uVar6 + 1;
    pCVar5 = (ConstPixelBufferAccess *)(pCVar5[3].m_size.m_data + 1);
  } while (uVar6 != 0x40);
  return;
}

Assistant:

void FragmentProcessor::executeSignedValueWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const tcu::BVec4& colorMask, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			const IVec4			originalValue	= colorBuffer.getPixelInt(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

			colorBuffer.setPixel(tcu::select(m_sampleRegister[regSampleNdx].signedValue, originalValue, colorMask), fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}